

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::
genTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  byte local_1a5;
  undefined1 local_198 [8];
  ostringstream buf;
  bool tessellationWidePoints;
  PointRenderCase *this_local;
  
  local_1a5 = 0;
  if ((*(byte *)((long)this + 0xd8) & 1) != 0) {
    local_1a5 = *(byte *)((long)this + 0x81) ^ 0xff;
  }
  buf._375_1_ = local_1a5 & 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n");
  pcVar2 = "";
  if ((buf._375_1_ & 1) != 0) {
    pcVar2 = "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           "layout(quads, point_mode) in;\nin highp vec4 tess_ctrl_color[];\nout highp vec4 tess_color;\nuniform highp vec4 u_posScale;\n\npatch in highp vec3 vp_bbox_clipMin;\npatch in highp vec3 vp_bbox_clipMax;\n"
                          );
  pcVar2 = "flat out highp float v_bbox_expansionSize;\n";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"flat out highp vec3 v_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMax;\n\n");
  pcVar2 = anon_unknown_1::BBoxRenderCase::genShaderFunction
                     ((BBoxRenderCase *)this,SHADER_FUNC_MIRROR_Y);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           "void main()\n{\n\t// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n\thighp float pointSize = "
                          );
  pcVar2 = "1.0";
  if ((buf._375_1_ & 1) != 0) {
    pcVar2 = "(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,";\n\tgl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n");
  if ((buf._375_1_ & 1) != 0) {
    std::operator<<((ostream *)local_198,"\tgl_PointSize = pointSize;\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\ttess_color = tess_ctrl_color[0];\n");
  pcVar2 = "v_bbox_expansionSize = pointSize;\n";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\tv_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin = vp_bbox_clipMin;\n\tv_");
  pcVar2 = "";
  if ((*(byte *)((long)this + 0x81) & 1) != 0) {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"bbox_clipMax = vp_bbox_clipMax;\n}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genTessellationEvaluationSource (void) const
{
	const bool			tessellationWidePoints = (m_isWidePointCase) && (!m_hasGeometryStage);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
		<<	((tessellationWidePoints) ? ("${TESSELLATION_POINT_SIZE_REQUIRE}\n") : (""))
		<<	"layout(quads, point_mode) in;"
			"\n"
			"in highp vec4 tess_ctrl_color[];\n"
			"out highp vec4 tess_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"patch in highp vec3 vp_bbox_clipMin;\n"
			"patch in highp vec3 vp_bbox_clipMax;\n"
		<<	((!m_hasGeometryStage) ? ("flat out highp float v_bbox_expansionSize;\n") : (""))
		<<	"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_Y)
		<<	"void main()\n"
			"{\n"
			"	// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n"
			"	highp float pointSize = " << ((tessellationWidePoints) ? ("(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)") : ("1.0")) << ";\n"
			"	gl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n";

	if (tessellationWidePoints)
		buf << "	gl_PointSize = pointSize;\n";

	buf <<	"	tess_color = tess_ctrl_color[0];\n"
		<<	((!m_hasGeometryStage) ? ("v_bbox_expansionSize = pointSize;\n") : (""))
		<<	"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin = vp_bbox_clipMin;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax = vp_bbox_clipMax;\n"
			"}\n";

	return buf.str();
}